

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpServer.cpp
# Opt level: O2

void __thiscall
Liby::http::HttpServer::HttpServer
          (HttpServer *this,string *root,shared_ptr<Liby::TcpServer> *server)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  std::__cxx11::string::string((string *)this,(string *)root);
  std::__shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>,
             &server->super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:17:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:17:26)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->readEventCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:19:9)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:19:9)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->acceptorCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:20:26)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(Liby::Connection_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/http/HttpServer.cpp:20:26)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  std::function<void_(Liby::Connection_&)>::operator=
            (&((this->http_server_).super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->erroEventCallback_,(function<void_(Liby::Connection_&)> *)&local_38);
  std::_Function_base::~_Function_base((_Function_base *)&local_38);
  TcpServer::start((this->http_server_).
                   super___shared_ptr<Liby::TcpServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  return;
}

Assistant:

HttpServer::HttpServer(const std::string &root,
                       const std::shared_ptr<TcpServer> &server)
    : root_(root), http_server_(server) {
    http_server_->onRead([this](Connection &conn) { handleReadEvent(conn); });
    http_server_->onAccept(
        [this](Connection &conn) { handleAcceptEvent(conn); });
    http_server_->onErro([this](Connection &conn) { handleErroEvent(conn); });
    http_server_->start();
}